

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O2

int i2d_EC_PUBKEY(EC_KEY *a,uchar **pp)

{
  int iVar1;
  int iVar2;
  tuple<evp_pkey_st_*,_bssl::internal::Deleter> pkey_00;
  UniquePtr<EVP_PKEY> pkey;
  
  if (a == (EC_KEY *)0x0) {
    iVar2 = 0;
  }
  else {
    pkey_00.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)EVP_PKEY_new();
    iVar2 = -1;
    pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
         pkey_00.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
    if (pkey_00.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
        (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0) {
      iVar1 = EVP_PKEY_set1_EC_KEY
                        ((EVP_PKEY *)
                         pkey_00.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,a);
      if (iVar1 != 0) {
        iVar2 = i2d_PUBKEY((EVP_PKEY *)
                           pkey_00.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,pp);
      }
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&pkey);
  }
  return iVar2;
}

Assistant:

int i2d_EC_PUBKEY(const EC_KEY *ec_key, uint8_t **outp) {
  if (ec_key == NULL) {
    return 0;
  }

  bssl::UniquePtr<EVP_PKEY> pkey(EVP_PKEY_new());
  if (pkey == nullptr ||
      !EVP_PKEY_set1_EC_KEY(pkey.get(), const_cast<EC_KEY *>(ec_key))) {
    return -1;
  }

  return i2d_PUBKEY(pkey.get(), outp);
}